

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-canvas.c
# Opt level: O2

void plutovg_canvas_restore(plutovg_canvas_t *canvas)

{
  plutovg_state_t *ppVar1;
  
  ppVar1 = canvas->state;
  if (ppVar1->next != (plutovg_state *)0x0) {
    canvas->state = ppVar1->next;
    plutovg_paint_destroy(ppVar1->paint);
    plutovg_font_face_destroy(ppVar1->font_face);
    *(undefined8 *)((long)&ppVar1->font_face + 4) = 0;
    (ppVar1->color).g = 0.0;
    (ppVar1->color).b = 0.0;
    ppVar1->paint = (plutovg_paint_t *)0x0;
    ppVar1->font_face = (plutovg_font_face_t *)0x0;
    *(undefined8 *)&(ppVar1->color).a = 0x3f8000003f800000;
    (ppVar1->matrix).b = 0.0;
    (ppVar1->matrix).c = 0.0;
    (ppVar1->matrix).d = 1.0;
    (ppVar1->matrix).e = 0.0;
    *(undefined8 *)&(ppVar1->matrix).f = 0x3f80000000000000;
    (ppVar1->stroke).style.cap = PLUTOVG_LINE_CAP_BUTT;
    (ppVar1->stroke).style.join = PLUTOVG_LINE_JOIN_MITER;
    *(undefined8 *)&(ppVar1->stroke).style.miter_limit = 0x41200000;
    (ppVar1->stroke).dash.array.size = 0;
    plutovg_span_buffer_reset(&ppVar1->clip_spans);
    ppVar1->winding = PLUTOVG_FILL_RULE_NON_ZERO;
    ppVar1->op = PLUTOVG_OPERATOR_SRC_OVER;
    ppVar1->font_size = 12.0;
    ppVar1->opacity = 1.0;
    ppVar1->clipping = false;
    ppVar1->next = canvas->freed_state;
    canvas->freed_state = ppVar1;
  }
  return;
}

Assistant:

void plutovg_canvas_restore(plutovg_canvas_t* canvas)
{
    if(canvas->state->next == NULL)
        return;
    plutovg_state_t* old_state = canvas->state;
    canvas->state = old_state->next;
    plutovg_state_reset(old_state);
    old_state->next = canvas->freed_state;
    canvas->freed_state = old_state;
}